

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

Variable __thiscall
LiteScript::CreateNamespace(LiteScript *this,Memory *memory,int count,char **names,Variable *values)

{
  Namespace *this_00;
  Object *pOVar1;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar2;
  ulong uVar3;
  Variable VVar4;
  
  Memory::Create((Memory *)this,(Type *)memory);
  pOVar1 = Variable::operator->((Variable *)this);
  puVar2 = extraout_RDX;
  if (count != 0) {
    this_00 = (Namespace *)pOVar1->data;
    uVar3 = 0;
    do {
      Namespace::DefineVariable(this_00,names[uVar3],values);
      uVar3 = uVar3 + 1;
      values = values + 1;
      puVar2 = extraout_RDX_00;
    } while ((uint)count != uVar3);
  }
  VVar4.nb_ref = puVar2;
  VVar4.obj = (Object *)this;
  return VVar4;
}

Assistant:

LiteScript::Variable LiteScript::CreateNamespace(Memory &memory, int count, const char **names, const Variable *values) {
    Variable v = memory.Create(Type::NAMESPACE);
    Namespace& n = v->GetData<Namespace>();
    for (unsigned int i = 0, sz = (unsigned int)count; i < sz; i++)
        n.DefineVariable(names[i], values[i]);
    return v;
}